

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_space.cpp
# Opt level: O3

void __thiscall Memory_space::write32(Memory_space *this,uint32_t address,uint32_t data)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  Page_entry *pPVar4;
  uint uVar5;
  
  if ((address & 3) != 0) {
    write8(this,address,(uint8_t)data);
    write8(this,address + 1,(uint8_t)(data >> 8));
    write8(this,address + 2,(uint8_t)(data >> 0x10));
    write8(this,address + 3,(uint8_t)(data >> 0x18));
  }
  uVar5 = address >> ((byte)this->page_bits & 0x1f) & this->page_table_mask;
  uVar2 = this->page_mask;
  pPVar4 = this->page_table;
  bVar1 = *(byte *)(pPVar4 + uVar5);
  if ((bVar1 & 1) == 0) {
    puVar3 = (uint8_t *)calloc((ulong)this->page_size,1);
    pPVar4[uVar5].data = puVar3;
    *(byte *)(pPVar4 + uVar5) = bVar1 | 1;
    pPVar4 = this->page_table;
  }
  *(uint32_t *)(pPVar4[uVar5].data + (uVar2 & address)) = data;
  return;
}

Assistant:

void Memory_space::write32(uint32_t address, uint32_t data)
{
	if ((address & 3) != 0) {
		write8(address, data);
		write8(address + 1, data >> 8);
		write8(address + 2, data >> 16);
		write8(address + 3, data >> 24);
	}
	unsigned page_index = (address >> page_bits) & page_table_mask;
	unsigned byte_offset = address & page_mask;
	if ( ! page_table[page_index].present) {
		page_table[page_index].data = (uint8_t*) calloc(page_size, 1);
		page_table[page_index].present = 1;
	}
	*(uint32_t*)(page_table[page_index].data + byte_offset) = data;
}